

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionTest.cpp
# Opt level: O0

void __thiscall ActionTest::deleteTest(ActionTest *this)

{
  Edge e;
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  ostream *this_00;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  _Self local_100;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_f8;
  _Self local_d8;
  _Self local_d0;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_c8;
  _Self local_a8;
  _Self local_a0;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_98;
  _Self local_78;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_70;
  unsigned_long local_50;
  unsigned_long local_48;
  property_type *local_40;
  undefined1 local_38 [8];
  Delete action;
  ActionTest *this_local;
  
  action.super_Action.edge.m_eproperty = this;
  pvVar2 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[](&this->rel,0);
  boost::
  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
            (&local_70,(boost *)0x0,1,(vertex_descriptor)&this->G,in_R8);
  local_50 = local_70.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
  local_48 = local_70.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
  local_40 = local_70.first.m_eproperty;
  e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
       local_70.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
  e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
       local_70.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
  e.m_eproperty = local_70.first.m_eproperty;
  Delete::Delete((Delete *)local_38,&pvVar2->a_pred,e);
  Delete::undo((Delete *)local_38);
  pvVar2 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[](&this->rel,0);
  sVar3 = std::
          set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
          ::size(&pvVar2->a_pred);
  if (sVar3 != 3) {
    __assert_fail("rel[0].a_pred.size()==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/ActionTest.cpp"
                  ,0x2f,"void ActionTest::deleteTest()");
  }
  pvVar2 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[](&this->rel,0);
  boost::
  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
            (&local_98,(boost *)0x0,1,(vertex_descriptor)&this->G,in_R8);
  local_78._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::find(&pvVar2->a_pred,&local_98.first);
  pvVar2 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[](&this->rel,0);
  local_a0._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::end(&pvVar2->a_pred);
  bVar1 = std::operator!=(&local_78,&local_a0);
  if (!bVar1) {
    __assert_fail("rel[0].a_pred.find(edge(0, 1, G).first) != rel[0].a_pred.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/ActionTest.cpp"
                  ,0x30,"void ActionTest::deleteTest()");
  }
  pvVar2 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[](&this->rel,0);
  boost::
  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
            (&local_c8,(boost *)0x0,2,(vertex_descriptor)&this->G,in_R8);
  local_a8._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::find(&pvVar2->a_pred,&local_c8.first);
  pvVar2 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[](&this->rel,0);
  local_d0._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::end(&pvVar2->a_pred);
  bVar1 = std::operator!=(&local_a8,&local_d0);
  if (!bVar1) {
    __assert_fail("rel[0].a_pred.find(edge(0, 2, G).first) != rel[0].a_pred.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/ActionTest.cpp"
                  ,0x31,"void ActionTest::deleteTest()");
  }
  pvVar2 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[](&this->rel,0);
  boost::
  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
            (&local_f8,(boost *)0x0,3,(vertex_descriptor)&this->G,in_R8);
  local_d8._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::find(&pvVar2->a_pred,&local_f8.first);
  pvVar2 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[](&this->rel,0);
  local_100._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::end(&pvVar2->a_pred);
  bVar1 = std::operator!=(&local_d8,&local_100);
  if (!bVar1) {
    __assert_fail("rel[0].a_pred.find(edge(0, 3, G).first) != rel[0].a_pred.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/ActionTest.cpp"
                  ,0x32,"void ActionTest::deleteTest()");
  }
  this_00 = std::operator<<((ostream *)&std::cout,"[+] delete action test OK!");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ActionTest::deleteTest()
{
    Delete action(rel[0].a_pred, edge(0, 1, G).first);
    action.undo();

    assert(rel[0].a_pred.size()==3);
    assert(rel[0].a_pred.find(edge(0, 1, G).first) != rel[0].a_pred.end());
    assert(rel[0].a_pred.find(edge(0, 2, G).first) != rel[0].a_pred.end());
    assert(rel[0].a_pred.find(edge(0, 3, G).first) != rel[0].a_pred.end());

    std::cout << "[+] delete action test OK!" << std::endl;
}